

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CShInstruction.cpp
# Opt level: O3

void __thiscall CShInstruction::~CShInstruction(CShInstruction *this)

{
  ~CShInstruction(this);
  operator_delete(this,200);
  return;
}

Assistant:

CShInstruction::~CShInstruction() = default;